

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O3

void __thiscall MT32Emu::TVP::targetPitchOffsetReached(TVP *this)

{
  PartialParam *pPVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  this->currentPitchOffset = (int)this->lfoPitchOffset + this->targetPitchOffsetWithoutLFO;
  if (this->phase - 3U < 2) {
    bVar2 = Part::getModulation(this->part);
    pPVar1 = this->partialParam;
    iVar3 = (uint)(pPVar1->pitchLFO).depth +
            ((uint)(pPVar1->pitchLFO).modSensitivity * (uint)bVar2 >> 7);
    iVar4 = iVar3 * -2;
    if (this->pitchOffsetChangePerBigTick < 1) {
      iVar4 = iVar3 * 2;
    }
    this->lfoPitchOffset = (Bit16s)iVar4;
    setupPitchChange(this,iVar4 + this->targetPitchOffsetWithoutLFO,'e' - (pPVar1->pitchLFO).rate);
  }
  else if (this->phase != 6) {
    nextPhase(this);
    return;
  }
  updatePitch(this);
  return;
}

Assistant:

void TVP::targetPitchOffsetReached() {
	currentPitchOffset = targetPitchOffsetWithoutLFO + lfoPitchOffset;

	switch (phase) {
	case 3:
	case 4:
	{
		int newLFOPitchOffset = (part->getModulation() * partialParam->pitchLFO.modSensitivity) >> 7;
		newLFOPitchOffset = (newLFOPitchOffset + partialParam->pitchLFO.depth) << 1;
		if (pitchOffsetChangePerBigTick > 0) {
			// Go in the opposite direction to last time
			newLFOPitchOffset = -newLFOPitchOffset;
		}
		lfoPitchOffset = newLFOPitchOffset;
		int targetPitchOffset = targetPitchOffsetWithoutLFO + lfoPitchOffset;
		setupPitchChange(targetPitchOffset, 101 - partialParam->pitchLFO.rate);
		updatePitch();
		break;
	}
	case 6:
		updatePitch();
		break;
	default:
		nextPhase();
	}
}